

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

bool Assimp::SceneCombiner::FindNameMatch
               (aiString *name,
               vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *input,uint cur)

{
  ulong uVar1;
  iterator iVar2;
  pointer pSVar3;
  uint uVar4;
  ulong uVar5;
  uint hash;
  
  uVar4 = 0;
  SuperFastHash(name->data,name->length,0);
  pSVar3 = (input->super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>).
           _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    uVar5 = (ulong)uVar4;
    uVar1 = ((long)(input->
                   super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) / 0x60;
    if (uVar1 <= uVar5) break;
    if (cur != uVar4) {
      iVar2 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::find(&pSVar3[uVar5].hashes._M_t,&hash);
      pSVar3 = (input->super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (iVar2._M_node != (_Base_ptr)((long)&pSVar3[uVar5].hashes._M_t._M_impl + 8U)) break;
    }
    uVar4 = uVar4 + 1;
  }
  return uVar5 < uVar1;
}

Assistant:

bool SceneCombiner::FindNameMatch(const aiString& name, std::vector<SceneHelper>& input, unsigned int cur) {
    const unsigned int hash = SuperFastHash(name.data, static_cast<uint32_t>(name.length));

    // Check whether we find a positive match in one of the given sets
    for (unsigned int i = 0; i < input.size(); ++i) {
        if (cur != i && input[i].hashes.find(hash) != input[i].hashes.end()) {
            return true;
        }
    }
    return false;
}